

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

idx_t duckdb::BinaryExecutor::SelectGenericLoopSwitch<unsigned_char,unsigned_char,duckdb::NotEquals>
                (uchar *ldata,uchar *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  SelectionVector *in_RCX;
  uchar *in_RDX;
  uchar *in_RSI;
  SelectionVector *in_R8;
  SelectionVector *in_R9;
  ValidityMask *unaff_retaddr;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  SelectionVector *in_stack_00000018;
  idx_t in_stack_ffffffffffffffb8;
  idx_t local_10;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar1))
  {
    local_10 = SelectGenericLoopSelSwitch<unsigned_char,unsigned_char,duckdb::NotEquals,true>
                         (in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb8,unaff_retaddr,
                          (ValidityMask *)in_stack_00000008,(SelectionVector *)in_stack_00000010,
                          in_stack_00000018);
  }
  else {
    local_10 = SelectGenericLoopSelSwitch<unsigned_char,unsigned_char,duckdb::NotEquals,false>
                         (in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb8,unaff_retaddr,
                          (ValidityMask *)in_stack_00000008,(SelectionVector *)in_stack_00000010,
                          in_stack_00000018);
  }
  return local_10;
}

Assistant:

static inline idx_t
	SelectGenericLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                        const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                        const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                        ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
#ifndef DUCKDB_SMALLER_BINARY
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			return SelectGenericLoopSelSwitch<LEFT_TYPE, RIGHT_TYPE, OP, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			return SelectGenericLoopSelSwitch<LEFT_TYPE, RIGHT_TYPE, OP, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
#else
		return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP>(ldata, rdata, lsel, rsel, result_sel, count, lvalidity,
		                                                    rvalidity, true_sel, false_sel);
#endif
	}